

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

bool __thiscall
aiMetadata::Set<std::_Bit_reference>(aiMetadata *this,uint index,string *key,_Bit_reference *value)

{
  bool bVar1;
  aiMetadataType aVar2;
  ulong uVar3;
  undefined8 *puVar4;
  _Bit_reference *value_local;
  string *key_local;
  uint index_local;
  aiMetadata *this_local;
  
  if (index < this->mNumProperties) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      aiString::operator=(this->mKeys + index,key);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(value);
      aVar2 = GetAiType(bVar1);
      this->mValues[index].mType = aVar2;
      puVar4 = (undefined8 *)operator_new(0x10);
      *puVar4 = value->_M_p;
      puVar4[1] = value->_M_mask;
      this->mValues[index].mData = puVar4;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline 
    bool Set( unsigned index, const std::string& key, const T& value ) {
        // In range assertion
        if ( index >= mNumProperties ) {
            return false;
        }

        // Ensure that we have a valid key.
        if ( key.empty() ) {
            return false;
        }

        // Set metadata key
        mKeys[index] = key;

        // Set metadata type
        mValues[index].mType = GetAiType(value);
        // Copy the given value to the dynamic storage
        mValues[index].mData = new T(value);

        return true;
    }